

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valfmt_set.c
# Opt level: O0

int mpt_valfmt_set(mpt_array *arr,mpt_convertable *src)

{
  uint32_t uVar1;
  int iVar2;
  mpt_buffer *pmVar3;
  long lVar4;
  undefined4 extraout_var;
  char *local_60;
  char *from;
  mpt_convertable *elem;
  mpt_value *val;
  mpt_buffer *buf;
  int local_38;
  int curr;
  int ret;
  mpt_value_format fmt;
  mpt_array tmp;
  mpt_iterator *it;
  mpt_convertable *src_local;
  mpt_array *arr_local;
  
  memset(&ret,0,8);
  if (src == (mpt_convertable *)0x0) {
    val = (mpt_value *)arr->_buf;
    if ((mpt_buffer *)val == (mpt_buffer *)0x0) {
      arr_local._4_4_ = 0;
    }
    else if ((mpt_valfmt_set::traits == (mpt_type_traits *)0x0) ||
            (mpt_valfmt_set::traits = mpt_type_traits(0x18),
            mpt_valfmt_set::traits == (mpt_type_traits *)0x0)) {
      arr_local._4_4_ = -4;
    }
    else {
      if (val == (mpt_value *)0x0) {
        pmVar3 = _mpt_buffer_alloc(0,0);
        if (pmVar3 == (mpt_buffer *)0x0) {
          return -4;
        }
        pmVar3->_content_traits = mpt_valfmt_set::traits;
      }
      else {
        if (mpt_valfmt_set::traits != (mpt_type_traits *)val->_type) {
          return -3;
        }
        lVar4 = (**(code **)((long)val->_addr + 0x18))(val,0);
        if (lVar4 != 0) {
          return -4;
        }
        uRam0000000000000018 = 0;
      }
      arr_local._4_4_ = 0x18;
    }
  }
  else {
    tmp._buf = (mpt_buffer *)0x0;
    local_38 = (*src->_vptr->convert)(src,0x86,&tmp);
    if ((local_38 < 1) || (tmp._buf == (mpt_buffer *)0x0)) {
      local_38 = (*src->_vptr->convert)(src,0x18,&curr);
      if (local_38 < 0) {
        local_60 = (char *)0x0;
        local_38 = (*src->_vptr->convert)(src,0x73,&local_60);
        if (local_38 < 0) {
          return local_38;
        }
        if ((local_38 != 0) && (iVar2 = mpt_valfmt_parse((mpt_array *)&ret,local_60), iVar2 < 0)) {
          return iVar2;
        }
      }
      else {
        buf._4_4_ = mpt_valfmt_add((mpt_array *)&ret,(mpt_value_format)curr);
        if ((int)buf._4_4_ < 0) {
          mpt_array_clone((mpt_array *)&ret,(mpt_array *)0x0);
          return buf._4_4_;
        }
      }
      local_38 = 0;
    }
    else {
      local_38 = 0;
      while( true ) {
        uVar1 = (*(tmp._buf)->_vptr->get_flags)(tmp._buf);
        elem = (mpt_convertable *)CONCAT44(extraout_var,uVar1);
        if (elem == (mpt_convertable *)0x0) break;
        curr = 0;
        if (((elem[1]._vptr == (_mpt_vptr_convertable *)0x80) ||
            (elem[1]._vptr == (_mpt_vptr_convertable *)0x801)) ||
           (((_mpt_vptr_convertable *)0xff < elem[1]._vptr &&
            (elem[1]._vptr < (_mpt_vptr_convertable *)0x800)))) {
          from = (char *)elem->_vptr->convert;
          if ((_func_int_mpt_convertable_ptr_mpt_type_t_void_ptr *)from !=
              (_func_int_mpt_convertable_ptr_mpt_type_t_void_ptr *)0x0) {
            (*(code *)**(undefined8 **)from)(from,0x18,&curr);
          }
        }
        else if ((elem[1]._vptr == (_mpt_vptr_convertable *)0x18) &&
                (elem->_vptr != (_mpt_vptr_convertable *)0x0)) {
          curr = *(int *)&elem->_vptr->convert;
        }
        iVar2 = mpt_valfmt_add((mpt_array *)&ret,(mpt_value_format)curr);
        buf._4_4_ = (uint)(iVar2 < 0);
        if (iVar2 < 0) {
          return buf._4_4_;
        }
        iVar2 = (*(tmp._buf)->_vptr->unref)(tmp._buf);
        buf._4_4_ = (uint)(iVar2 < 1);
        if (iVar2 < 1) break;
        local_38 = local_38 + 1;
      }
    }
    mpt_array_clone(arr,(mpt_array *)&ret);
    mpt_array_clone((mpt_array *)&ret,(mpt_array *)0x0);
    arr_local._4_4_ = local_38;
  }
  return arr_local._4_4_;
}

Assistant:

extern int mpt_valfmt_set(MPT_STRUCT(array) *arr, MPT_INTERFACE(convertable) *src)
{
	MPT_INTERFACE(iterator) *it;
	MPT_STRUCT(array) tmp = MPT_ARRAY_INIT;
	MPT_STRUCT(value_format) fmt;
	int ret, curr;
	
	if (!src) {
		static const MPT_STRUCT(type_traits) *traits = 0;
		MPT_STRUCT(buffer) *buf;
		if (!(buf = arr->_buf)) {
			return 0;
		}
		/* initialize traits binding */
		if (!traits || (!(traits = mpt_type_traits(MPT_ENUM(TypeValFmt))))) {
			return MPT_ERROR(BadOperation);
		}
		if (!buf) {
			if (!(buf = _mpt_buffer_alloc(0, 0))) {
				return MPT_ERROR(BadOperation);
			}
			buf->_content_traits = traits;
		}
		else if (traits != buf->_content_traits) {
			return MPT_ERROR(BadType);
		}
		else {
			if ((buf = buf->_vptr->detach(buf, 0))) {
				return MPT_ERROR(BadOperation);
			}
			buf->_used = 0;
		}
		return MPT_ENUM(TypeValFmt);
	}
	/* get elements from iterator */
	it = 0;
	if ((ret = src->_vptr->convert(src, MPT_ENUM(TypeIteratorPtr), &it)) > 0
	    && it) {
		ret = 0;
		while (1) {
			static const MPT_STRUCT(value_format) def = MPT_VALFMT_INIT;
			const MPT_STRUCT(value) *val;
			
			if (!(val = it->_vptr->value(it))) {
				break;
			}
			fmt = def;
			if (MPT_type_isConvertable(val->_type)) {
				MPT_INTERFACE(convertable) *elem;
				if ((elem = *((void * const *) val->_addr))) {
					elem->_vptr->convert(elem, MPT_ENUM(TypeValFmt), &fmt);
				}
			}
			else if (val->_type == MPT_ENUM(TypeValFmt) && val->_addr) {
				fmt = *((const MPT_STRUCT(value_format) *) val->_addr);
			}
			if ((curr = mpt_valfmt_add(&tmp, fmt) < 0)) {
				return curr;
			}
			if ((curr = it->_vptr->advance(it) <= 0)) {
				break;
			}
			++ret;
		}
	}
	/* assign single element */
	else if ((ret = src->_vptr->convert(src, MPT_ENUM(TypeValFmt), &fmt)) >= 0) {
		if ((curr = mpt_valfmt_add(&tmp, fmt)) < 0) {
			mpt_array_clone(&tmp, 0);
			return curr;
		}
		ret = 0;
	}
	/* get elements from string value */
	else {
		const char *from = 0;
		if ((ret = src->_vptr->convert(src, 's', &from)) < 0) {
			return ret;
		}
		if (ret && (ret = mpt_valfmt_parse(&tmp, from)) < 0) {
			return ret;
		}
		ret = 0;
	}
	mpt_array_clone(arr, &tmp);
	mpt_array_clone(&tmp, 0);
	return ret;
}